

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_add_tlmarker
                   (OPJ_UINT32 tileno,opj_codestream_index_t *cstr_index,OPJ_UINT32 type,
                   OPJ_OFF_T pos,OPJ_UINT32 len)

{
  uint uVar1;
  opj_tile_index_t *poVar2;
  opj_marker_info_t *poVar3;
  opj_marker_info_t **ppoVar4;
  ulong uVar5;
  
  if (cstr_index == (opj_codestream_index_t *)0x0) {
    __assert_fail("cstr_index != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1d08,
                  "OPJ_BOOL opj_j2k_add_tlmarker(OPJ_UINT32, opj_codestream_index_t *, OPJ_UINT32, OPJ_OFF_T, OPJ_UINT32)"
                 );
  }
  poVar2 = cstr_index->tile_index;
  if (poVar2 != (opj_tile_index_t *)0x0) {
    if (poVar2[tileno].maxmarknum < poVar2[tileno].marknum + 1) {
      uVar5 = (ulong)((float)poVar2[tileno].maxmarknum + 100.0);
      poVar2[tileno].maxmarknum = (OPJ_UINT32)uVar5;
      poVar3 = (opj_marker_info_t *)opj_realloc(poVar2[tileno].marker,(uVar5 & 0xffffffff) * 0x18);
      ppoVar4 = &cstr_index->tile_index[tileno].marker;
      if (poVar3 == (opj_marker_info_t *)0x0) {
        opj_free(*ppoVar4);
        poVar2 = cstr_index->tile_index;
        poVar2[tileno].marker = (opj_marker_info_t *)0x0;
        poVar2[tileno].maxmarknum = 0;
        poVar2[tileno].marknum = 0;
        return 0;
      }
      *ppoVar4 = poVar3;
    }
    poVar2 = cstr_index->tile_index;
    poVar3 = poVar2[tileno].marker;
    uVar1 = poVar2[tileno].marknum;
    poVar3[uVar1].type = (unsigned_short)type;
    poVar3[uVar1].pos = (long)(int)pos;
    poVar3[uVar1].len = len;
    poVar2[tileno].marknum = poVar2[tileno].marknum + 1;
    if (type == 0xff90) {
      if (poVar2[tileno].tp_index != (opj_tp_index_t *)0x0) {
        poVar2[tileno].tp_index[poVar2[tileno].current_tpsno].start_pos = pos;
      }
    }
    return 1;
  }
  __assert_fail("cstr_index->tile_index != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x1d09,
                "OPJ_BOOL opj_j2k_add_tlmarker(OPJ_UINT32, opj_codestream_index_t *, OPJ_UINT32, OPJ_OFF_T, OPJ_UINT32)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_add_tlmarker(OPJ_UINT32 tileno,
                                     opj_codestream_index_t *cstr_index, OPJ_UINT32 type, OPJ_OFF_T pos,
                                     OPJ_UINT32 len)
{
    assert(cstr_index != 00);
    assert(cstr_index->tile_index != 00);

    /* expand the list? */
    if ((cstr_index->tile_index[tileno].marknum + 1) >
            cstr_index->tile_index[tileno].maxmarknum) {
        opj_marker_info_t *new_marker;
        cstr_index->tile_index[tileno].maxmarknum = (OPJ_UINT32)(100 +
                (OPJ_FLOAT32) cstr_index->tile_index[tileno].maxmarknum);
        new_marker = (opj_marker_info_t *) opj_realloc(
                         cstr_index->tile_index[tileno].marker,
                         cstr_index->tile_index[tileno].maxmarknum * sizeof(opj_marker_info_t));
        if (! new_marker) {
            opj_free(cstr_index->tile_index[tileno].marker);
            cstr_index->tile_index[tileno].marker = NULL;
            cstr_index->tile_index[tileno].maxmarknum = 0;
            cstr_index->tile_index[tileno].marknum = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add tl marker\n"); */
            return OPJ_FALSE;
        }
        cstr_index->tile_index[tileno].marker = new_marker;
    }

    /* add the marker */
    cstr_index->tile_index[tileno].marker[cstr_index->tile_index[tileno].marknum].type
        = (OPJ_UINT16)type;
    cstr_index->tile_index[tileno].marker[cstr_index->tile_index[tileno].marknum].pos
        = (OPJ_INT32)pos;
    cstr_index->tile_index[tileno].marker[cstr_index->tile_index[tileno].marknum].len
        = (OPJ_INT32)len;
    cstr_index->tile_index[tileno].marknum++;

    if (type == J2K_MS_SOT) {
        OPJ_UINT32 l_current_tile_part = cstr_index->tile_index[tileno].current_tpsno;

        if (cstr_index->tile_index[tileno].tp_index) {
            cstr_index->tile_index[tileno].tp_index[l_current_tile_part].start_pos = pos;
        }

    }
    return OPJ_TRUE;
}